

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydatapointer.h
# Opt level: O2

void __thiscall
QArrayDataPointer<QSsl::ImplementedClass>::relocate
          (QArrayDataPointer<QSsl::ImplementedClass> *this,qsizetype offset,ImplementedClass **data)

{
  ImplementedClass *d_first;
  ImplementedClass *pIVar1;
  
  d_first = this->ptr + offset;
  QtPrivate::q_relocate_overlap_n<QSsl::ImplementedClass,long_long>(this->ptr,this->size,d_first);
  if (data != (ImplementedClass **)0x0) {
    pIVar1 = *data;
    if ((this->ptr <= pIVar1) && (pIVar1 < this->ptr + this->size)) {
      *data = pIVar1 + offset;
    }
  }
  this->ptr = d_first;
  return;
}

Assistant:

void relocate(qsizetype offset, const T **data = nullptr)
    {
        T *res = this->ptr + offset;
        QtPrivate::q_relocate_overlap_n(this->ptr, this->size, res);
        // first update data pointer, then this->ptr
        if (data && QtPrivate::q_points_into_range(*data, *this))
            *data += offset;
        this->ptr = res;
    }